

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_filenames.c
# Opt level: O3

void test_filename(char *prefix,int dlen,int flen)

{
  int iVar1;
  mode_t mVar2;
  archive *paVar3;
  archive_entry *paVar4;
  char *pcVar5;
  uint uVar6;
  size_t sVar7;
  longlong lVar8;
  wchar_t wVar9;
  int iVar10;
  long lVar11;
  size_t used;
  char filename [400];
  char dirname [400];
  char buff [8192];
  archive_entry *local_2368;
  size_t local_2360;
  char local_2358 [400];
  char local_21c8 [400];
  undefined1 local_2038 [8200];
  
  iVar1 = 0;
  sVar7 = 0;
  if (prefix != (char *)0x0) {
    strcpy(local_2358,prefix);
    sVar7 = strlen(prefix);
  }
  uVar6 = (uint)sVar7;
  if (0 < dlen) {
    if ((int)uVar6 < dlen) {
      memset(local_2358 + (int)uVar6,0x61,(ulong)(~uVar6 + dlen) + 1);
      sVar7 = (size_t)(uint)dlen;
    }
    uVar6 = (int)sVar7 + 1;
    local_2358[sVar7 & 0xffffffff] = '/';
    iVar1 = 1;
  }
  iVar10 = flen + dlen + iVar1;
  if ((int)uVar6 < iVar10) {
    lVar11 = (long)(int)uVar6;
    memset(local_2358 + lVar11,0x62,(ulong)(~uVar6 + iVar1 + flen + dlen) + 1);
    do {
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar10);
    uVar6 = (uint)lVar11;
  }
  local_2358[(int)uVar6] = '\0';
  strcpy(local_21c8,local_2358);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'<',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'=',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'?',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a,0)",paVar3);
  iVar1 = archive_write_open_memory(paVar3,local_2038,0x2000,&local_2360);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'@',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  paVar4 = archive_entry_new();
  local_2368 = paVar4;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'E',(uint)(paVar4 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar4,local_2358);
  archive_entry_set_mode(paVar4,0x81ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar3,paVar4);
  if (flen < 0x65) {
    pcVar5 = "0";
    wVar9 = L'L';
    lVar8 = 0;
  }
  else {
    pcVar5 = "ARCHIVE_FAILED";
    wVar9 = L'J';
    lVar8 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar9,lVar8,pcVar5,(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'S',(uint)(paVar4 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar4,local_21c8);
  archive_entry_set_mode(paVar4,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar3,paVar4);
  if (flen < 100) {
    pcVar5 = "0";
    wVar9 = L'Z';
    lVar8 = 0;
  }
  else {
    pcVar5 = "ARCHIVE_FAILED";
    wVar9 = L'X';
    lVar8 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar9,lVar8,pcVar5,(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  sVar7 = strlen(local_21c8);
  (local_21c8 + sVar7)[0] = '/';
  (local_21c8 + sVar7)[1] = '\0';
  paVar4 = archive_entry_new();
  local_2368 = paVar4;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'd',(uint)(paVar4 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar4,local_21c8);
  archive_entry_set_mode(paVar4,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar3,paVar4);
  if (flen < 100) {
    pcVar5 = "0";
    wVar9 = L'k';
    lVar8 = 0;
  }
  else {
    pcVar5 = "ARCHIVE_FAILED";
    wVar9 = L'i';
    lVar8 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar9,lVar8,pcVar5,(long)iVar1,"archive_write_header(a, ae)",paVar3);
  archive_entry_free(paVar4);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'v',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'w',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'x',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,local_2038,local_2360);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'y',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",paVar3);
  if (flen < 0x65) {
    iVar1 = archive_read_next_header(paVar3,&local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'}',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
    failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
    pcVar5 = archive_entry_pathname(local_2368);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x7f',local_2358,"filename",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
    mVar2 = archive_entry_mode(local_2368);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'\x80',0x81ed,"(S_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    if (flen != 100) {
      iVar1 = archive_read_next_header(paVar3,&local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x8b',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
      mVar2 = archive_entry_mode(local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x8c',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)"
                       ,(void *)0x0);
      failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
      pcVar5 = archive_entry_pathname(local_2368);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                 ,L'\x8e',local_21c8,"dirname",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0'
                );
      iVar1 = archive_read_next_header(paVar3,&local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x92',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
      mVar2 = archive_entry_mode(local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x93',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)"
                       ,(void *)0x0);
      pcVar5 = archive_entry_pathname(local_2368);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                 ,L'\x94',local_21c8,"dirname",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0'
                );
    }
  }
  failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d",
          (ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_read_next_header(paVar3,&local_2368);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x99',1,"1",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_filename(const char *prefix, int dlen, int flen)
{
	char buff[8192];
	char filename[400];
	char dirname[400];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	char *p;
	int i;

	p = filename;
	if (prefix) {
		strcpy(filename, prefix);
		p += strlen(p);
	}
	if (dlen > 0) {
		for (i = 0; i < dlen; i++)
			*p++ = 'a';
		*p++ = '/';
	}
	for (i = 0; i < flen; i++)
		*p++ = 'b';
	*p = '\0';

	strcpy(dirname, filename);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax_restricted(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a,0));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, filename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	failure("Pathname %d/%d", dlen, flen);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a dir to it (without trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("Dirname %d/%d", dlen, flen);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Tar adds a '/' to directory names. */
	strcat(dirname, "/");

	/*
	 * Write a dir to it (with trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("Dirname %d/%d", dlen, flen);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	/* Read the file and check the filename. */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString(filename, archive_entry_pathname(ae));
	assertEqualInt((S_IFREG | 0755), archive_entry_mode(ae));

	/*
	 * Read the two dirs and check the names.
	 *
	 * Both dirs should read back with the same name, since
	 * tar should add a trailing '/' to any dir that doesn't
	 * already have one.  We only report the first such failure
	 * here.
	 */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString(dirname, archive_entry_pathname(ae));
	assert((S_IFDIR | 0755) == archive_entry_mode(ae));

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString(dirname, archive_entry_pathname(ae));
	assert((S_IFDIR | 0755) == archive_entry_mode(ae));

	/* Verify the end of the archive. */
	assert(1 == archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}